

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O1

pair<double,_double> __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_minimum_maximum
          (Persistence_landscape_on_grid *this)

{
  double dVar1;
  pointer pvVar2;
  pointer *ppdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  pair<double,_double> pVar9;
  
  pvVar2 = (this->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->values_of_landscapes).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar4 == 0) {
    return (pair<double,_double>)(ZEXT816(0xffefffffffffffff) << 0x40);
  }
  lVar4 = (lVar4 >> 3) * -0x5555555555555555;
  ppdVar3 = (pointer *)
            ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data + 8);
  dVar5 = -1.79769313486232e+308;
  dVar6 = 0.0;
  do {
    if (*ppdVar3 != ((_Vector_impl_data *)(ppdVar3 + -1))->_M_start) {
      dVar7 = *((_Vector_impl_data *)(ppdVar3 + -1))->_M_start;
      dVar8 = dVar7;
      if (dVar7 <= dVar5) {
        dVar8 = dVar5;
      }
      dVar1 = (*ppdVar3)[-1];
      dVar5 = dVar1;
      if (dVar1 <= dVar8) {
        dVar5 = dVar8;
      }
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
      dVar6 = dVar1;
      if (dVar7 <= dVar1) {
        dVar6 = dVar7;
      }
    }
    ppdVar3 = ppdVar3 + 3;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  pVar9.second = dVar5;
  pVar9.first = dVar6;
  return pVar9;
}

Assistant:

std::pair<double, double> compute_minimum_maximum() const {
    // since the function can only be entirely positive or negative, the maximal value will be an extremal value in the
    // arrays:
    double max_value = -std::numeric_limits<double>::max();
    double min_value = 0;
    for (size_t i = 0; i != this->values_of_landscapes.size(); ++i) {
      if (this->values_of_landscapes[i].size()) {
        if (this->values_of_landscapes[i][0] > max_value) max_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] > max_value)
          max_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];

        if (this->values_of_landscapes[i][0] < min_value) min_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] < min_value)
          min_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];
      }
    }
    return std::make_pair(min_value, max_value);
  }